

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

tmbstr MergeProperties(TidyDocImpl *doc,ctmbstr s1,ctmbstr s2)

{
  StyleProp *pSVar1;
  tmbstr ptVar2;
  StyleProp *prop;
  tmbstr s;
  ctmbstr s2_local;
  ctmbstr s1_local;
  TidyDocImpl *doc_local;
  
  pSVar1 = CreateProps(doc,(StyleProp *)0x0,s1);
  pSVar1 = CreateProps(doc,pSVar1,s2);
  ptVar2 = CreatePropString(doc,pSVar1);
  FreeStyleProps(doc,pSVar1);
  return ptVar2;
}

Assistant:

static tmbstr MergeProperties( TidyDocImpl* doc, ctmbstr s1, ctmbstr s2 )
{
    tmbstr s;
    StyleProp *prop;

    prop = CreateProps(doc, NULL, s1);
    prop = CreateProps(doc, prop, s2);
    s = CreatePropString(doc, prop);
    FreeStyleProps(doc, prop);
    return s;
}